

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumValueDescriptorProto::SharedDtor(EnumValueDescriptorProto *this)

{
  EnumValueOptions *this_00;
  void *pvVar1;
  LogMessage *other;
  LogMessage local_58;
  LogFinisher local_19;
  
  pvVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  if (pvVar1 != (void *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/descriptor.pb.cc"
               ,0x1453);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: GetArena() == nullptr: ");
    internal::LogFinisher::operator=(&local_19,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  internal::ArenaStringPtr::DestroyNoArena
            (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  if (this != (EnumValueDescriptorProto *)_EnumValueDescriptorProto_default_instance_) {
    this_00 = this->options_;
    if (this_00 != (EnumValueOptions *)0x0) {
      EnumValueOptions::~EnumValueOptions(this_00);
    }
    operator_delete(this_00);
  }
  return;
}

Assistant:

void EnumValueDescriptorProto::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete options_;
}